

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOBLoader.cpp
# Opt level: O3

void __thiscall Assimp::LWOImporter::LoadLWOBSurface(LWOImporter *this,uint size)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_> *this_00;
  uint8_t *puVar3;
  pointer pSVar4;
  byte *pbVar5;
  ushort uVar6;
  uint *puVar7;
  uint8_t *puVar8;
  uint *puVar9;
  Logger *pLVar10;
  Texture *this_01;
  runtime_error *prVar11;
  uint uVar12;
  Axes AVar13;
  int iVar14;
  ulong uVar15;
  TextureList *list;
  char *message;
  ulong uVar16;
  uint *puVar17;
  uint uVar18;
  Surface local_178;
  
  puVar7 = (uint *)(this->mFileBuffer + size);
  this_00 = this->mSurfaces;
  LWO::Surface::Surface(&local_178);
  std::vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>::
  emplace_back<Assimp::LWO::Surface>(this_00,&local_178);
  LWO::Surface::~Surface(&local_178);
  puVar3 = this->mFileBuffer;
  pSVar4 = (this->mSurfaces->
           super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar8 = puVar3;
  if (*puVar3 != '\0') {
    uVar12 = 1;
    do {
      puVar8 = puVar8 + 1;
      if (size < uVar12) {
        pLVar10 = DefaultLogger::get();
        Logger::warn(pLVar10,"LWO: Invalid file, string is is too long");
        puVar8 = this->mFileBuffer;
        break;
      }
      this->mFileBuffer = puVar8;
      uVar12 = uVar12 + 1;
    } while (*puVar8 != '\0');
  }
  paVar1 = &local_178.mName.field_2;
  local_178.mName._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,puVar3);
  std::__cxx11::string::operator=((string *)(pSVar4 + -1),(string *)&local_178);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178.mName._M_dataplus._M_p != paVar1) {
    operator_delete(local_178.mName._M_dataplus._M_p);
  }
  uVar16 = (ulong)((int)puVar8 - (int)puVar3 & 1);
  puVar3 = this->mFileBuffer;
  puVar17 = (uint *)(puVar3 + (2 - uVar16));
  this->mFileBuffer = (uint8_t *)puVar17;
  puVar9 = (uint *)(puVar3 + (8 - uVar16));
  if (puVar9 < puVar7) {
    this_01 = (Texture *)0x0;
    do {
      uVar12 = *puVar17;
      this->mFileBuffer = (uint8_t *)(puVar17 + 1);
      uVar18 = puVar17[1];
      this->mFileBuffer = (uint8_t *)puVar9;
      uVar16 = (ulong)(ushort)((ushort)uVar18 << 8 | (ushort)uVar18 >> 8);
      if (puVar7 < (uint *)((long)puVar9 + uVar16)) {
        pLVar10 = DefaultLogger::get();
        Logger::error(pLVar10,"LWOB: Invalid surface chunk length. Trying to continue.");
        puVar9 = (uint *)this->mFileBuffer;
        uVar16 = (long)puVar7 - (long)puVar9;
      }
      uVar18 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
      uVar15 = uVar16 & 0xffff;
      uVar12 = (uint)uVar15;
      if ((int)uVar18 < 0x534d414e) {
        if ((int)uVar18 < 0x44544558) {
          if ((int)uVar18 < 0x43544558) {
            list = &pSVar4[-1].mBumpTextures;
            if (uVar18 == 0x42544558) {
LAB_0071b8a3:
              this_01 = SetupNewTextureLWOB(this,list,uVar12);
            }
            else if (uVar18 == 0x434f4c52) {
              if (uVar12 < 3) {
                prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
                local_178.mName._M_dataplus._M_p = (pointer)&local_178.mName.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_178,"LWO: COLR chunk is too small","");
                std::runtime_error::runtime_error(prVar11,(string *)&local_178);
                *(undefined ***)prVar11 = &PTR__runtime_error_008dc448;
                __cxa_throw(prVar11,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
              this->mFileBuffer = (byte *)((long)puVar9 + 1);
              pSVar4[-1].mColor.r = (float)(byte)*puVar9 / 255.0;
              pbVar5 = this->mFileBuffer;
              this->mFileBuffer = pbVar5 + 1;
              pSVar4[-1].mColor.g = (float)*pbVar5 / 255.0;
              pbVar5 = this->mFileBuffer;
              this->mFileBuffer = pbVar5 + 1;
              pSVar4[-1].mColor.b = (float)*pbVar5 / 255.0;
            }
          }
          else {
            list = &pSVar4[-1].mColorTextures;
            if (uVar18 == 0x43544558) goto LAB_0071b8a3;
            if (uVar18 == 0x44494646) {
              if (uVar12 < 2) {
                prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
                local_178.mName._M_dataplus._M_p = (pointer)&local_178.mName.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_178,"LWO: DIFF chunk is too small","");
                std::runtime_error::runtime_error(prVar11,(string *)&local_178);
                *(undefined ***)prVar11 = &PTR__runtime_error_008dc448;
                __cxa_throw(prVar11,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
              uVar12 = *puVar9;
              this->mFileBuffer = (uint8_t *)((long)puVar9 + 2);
              pSVar4[-1].mDiffuseValue =
                   (float)(ushort)((ushort)uVar12 << 8 | (ushort)uVar12 >> 8) / 255.0;
            }
          }
        }
        else if ((int)uVar18 < 0x474c4f53) {
          list = &pSVar4[-1].mDiffuseTextures;
          if (uVar18 == 0x44544558) goto LAB_0071b8a3;
          if (uVar18 == 0x464c4147) {
            if (uVar12 < 2) {
              prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_178.mName._M_dataplus._M_p = (pointer)&local_178.mName.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_178,"LWO: FLAG chunk is too small","");
              std::runtime_error::runtime_error(prVar11,(string *)&local_178);
              *(undefined ***)prVar11 = &PTR__runtime_error_008dc448;
              __cxa_throw(prVar11,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
            uVar12 = *puVar9;
            this->mFileBuffer = (uint8_t *)((long)puVar9 + 2);
            uVar6 = (ushort)uVar12 >> 8;
            if ((uVar6 & 4) != 0) {
              pSVar4[-1].mMaximumSmoothAngle = 1.56207;
            }
            if ((uVar6 & 8) != 0) {
              pSVar4[-1].mColorHighlights = 1.0;
            }
            if (((ushort)uVar12 & 1) != 0) {
              pSVar4[-1].bDoubleSided = true;
            }
          }
        }
        else if (uVar18 == 0x474c4f53) {
          if (uVar12 < 2) {
            prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_178.mName._M_dataplus._M_p = (pointer)&local_178.mName.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_178,"LWO: GLOS chunk is too small","");
            std::runtime_error::runtime_error(prVar11,(string *)&local_178);
            *(undefined ***)prVar11 = &PTR__runtime_error_008dc448;
            __cxa_throw(prVar11,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          uVar12 = *puVar9;
          this->mFileBuffer = (uint8_t *)((long)puVar9 + 2);
          pSVar4[-1].mGlossiness = (float)(ushort)((ushort)uVar12 << 8 | (ushort)uVar12 >> 8);
        }
        else if (uVar18 == 0x4c554d49) {
          if (uVar12 < 2) {
            prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_178.mName._M_dataplus._M_p = (pointer)&local_178.mName.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_178,"LWO: LUMI chunk is too small","");
            std::runtime_error::runtime_error(prVar11,(string *)&local_178);
            *(undefined ***)prVar11 = &PTR__runtime_error_008dc448;
            __cxa_throw(prVar11,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          uVar12 = *puVar9;
          this->mFileBuffer = (uint8_t *)((long)puVar9 + 2);
          pSVar4[-1].mLuminosity =
               (float)(ushort)((ushort)uVar12 << 8 | (ushort)uVar12 >> 8) / 255.0;
        }
      }
      else if ((int)uVar18 < 0x54494d47) {
        if ((int)uVar18 < 0x53544558) {
          if (uVar18 == 0x534d414e) {
            if (uVar12 < 4) {
              prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_178.mName._M_dataplus._M_p = (pointer)&local_178.mName.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_178,"LWO: SMAN chunk is too small","");
              std::runtime_error::runtime_error(prVar11,(string *)&local_178);
              *(undefined ***)prVar11 = &PTR__runtime_error_008dc448;
              __cxa_throw(prVar11,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
            uVar12 = *puVar9;
            this->mFileBuffer = (uint8_t *)(puVar9 + 1);
            pSVar4[-1].mMaximumSmoothAngle =
                 (float)(uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                        (uVar12 & 0x7f) << 0x18);
          }
          else if (uVar18 == 0x53504543) {
            if (uVar12 < 2) {
              prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_178.mName._M_dataplus._M_p = (pointer)&local_178.mName.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_178,"LWO: SPEC chunk is too small","");
              std::runtime_error::runtime_error(prVar11,(string *)&local_178);
              *(undefined ***)prVar11 = &PTR__runtime_error_008dc448;
              __cxa_throw(prVar11,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
            uVar12 = *puVar9;
            this->mFileBuffer = (uint8_t *)((long)puVar9 + 2);
            pSVar4[-1].mSpecularValue =
                 (float)(ushort)((ushort)uVar12 << 8 | (ushort)uVar12 >> 8) / 255.0;
          }
        }
        else {
          list = &pSVar4[-1].mSpecularTextures;
          if (uVar18 == 0x53544558) goto LAB_0071b8a3;
          if (uVar18 == 0x54464c47) {
            if (uVar12 < 2) {
              prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_178.mName._M_dataplus._M_p = (pointer)&local_178.mName.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_178,"LWO: TFLG chunk is too small","");
              std::runtime_error::runtime_error(prVar11,(string *)&local_178);
              *(undefined ***)prVar11 = &PTR__runtime_error_008dc448;
              __cxa_throw(prVar11,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
            if (this_01 == (Texture *)0x0) {
              pLVar10 = DefaultLogger::get();
              message = "LWOB: Unexpected TFLG chunk";
              goto LAB_0071b8eb;
            }
            uVar6 = (ushort)*puVar9 >> 8;
            this->mFileBuffer = (uint8_t *)((long)puVar9 + 2);
            AVar13 = AXIS_X;
            if ((((uVar6 & 1) != 0) || (AVar13 = AXIS_Y, (uVar6 & 2) != 0)) ||
               (AVar13 = AXIS_Z, (uVar6 & 4) != 0)) {
              this_01->majorAxis = AVar13;
            }
            if ((uVar6 & 0x10) != 0) {
              pLVar10 = DefaultLogger::get();
              Logger::warn(pLVar10,"LWOB: Ignoring \'negate\' flag on texture");
            }
          }
        }
      }
      else if ((int)uVar18 < 0x54544558) {
        if (uVar18 == 0x54494d47) {
          if (this_01 == (Texture *)0x0) {
            pLVar10 = DefaultLogger::get();
            message = "LWOB: Unexpected TIMG chunk";
LAB_0071b8eb:
            Logger::warn(pLVar10,message);
LAB_0071b906:
            this_01 = (Texture *)0x0;
          }
          else {
            bVar2 = (byte)*puVar9;
            puVar17 = puVar9;
            while (bVar2 != 0) {
              puVar17 = (uint *)((long)puVar17 + 1);
              iVar14 = (int)uVar15;
              uVar15 = (ulong)(iVar14 - 1);
              if (iVar14 == 0) {
                pLVar10 = DefaultLogger::get();
                Logger::warn(pLVar10,"LWO: Invalid file, string is is too long");
                puVar17 = (uint *)this->mFileBuffer;
                break;
              }
              this->mFileBuffer = (uint8_t *)puVar17;
              bVar2 = *(byte *)puVar17;
            }
            paVar1 = &local_178.mName.field_2;
            local_178.mName._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,puVar9,puVar17);
            std::__cxx11::string::operator=((string *)this_01,(string *)&local_178);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_178.mName._M_dataplus._M_p != paVar1) {
              operator_delete(local_178.mName._M_dataplus._M_p);
            }
            this->mFileBuffer = this->mFileBuffer + (2 - (ulong)((int)puVar17 - (int)puVar9 & 1));
          }
        }
        else if (uVar18 == 0x5452414e) {
          if (uVar12 < 2) {
            prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_178.mName._M_dataplus._M_p = (pointer)&local_178.mName.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_178,"LWO: TRAN chunk is too small","");
            std::runtime_error::runtime_error(prVar11,(string *)&local_178);
            *(undefined ***)prVar11 = &PTR__runtime_error_008dc448;
            __cxa_throw(prVar11,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          uVar12 = *puVar9;
          this->mFileBuffer = (uint8_t *)((long)puVar9 + 2);
          pSVar4[-1].mTransparency =
               (float)(ushort)((ushort)uVar12 << 8 | (ushort)uVar12 >> 8) / 255.0;
        }
      }
      else {
        list = &pSVar4[-1].mOpacityTextures;
        if (uVar18 == 0x54544558) goto LAB_0071b8a3;
        if (uVar18 == 0x5456414c) {
          if (uVar12 == 0) {
            prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_178.mName._M_dataplus._M_p = (pointer)&local_178.mName.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_178,"LWO: TVAL chunk is too small","");
            std::runtime_error::runtime_error(prVar11,(string *)&local_178);
            *(undefined ***)prVar11 = &PTR__runtime_error_008dc448;
            __cxa_throw(prVar11,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          if (this_01 == (Texture *)0x0) {
            pLVar10 = DefaultLogger::get();
            Logger::error(pLVar10,"LWOB: Unexpected TVAL chunk");
            goto LAB_0071b906;
          }
          this->mFileBuffer = (byte *)((long)puVar9 + 1);
          this_01->mStrength = (float)(byte)*puVar9 / 255.0;
        }
      }
      puVar17 = (uint *)((long)puVar9 + (uVar16 & 0xffff));
      this->mFileBuffer = (uint8_t *)puVar17;
      puVar9 = (uint *)((long)puVar17 + 6);
    } while (puVar9 < puVar7);
  }
  return;
}

Assistant:

void LWOImporter::LoadLWOBSurface(unsigned int size)
{
    LE_NCONST uint8_t* const end = mFileBuffer + size;

    mSurfaces->push_back( LWO::Surface () );
    LWO::Surface& surf = mSurfaces->back();
    LWO::Texture* pTex = NULL;

    GetS0(surf.mName,size);
    bool running = true;
    while (running)    {
        if (mFileBuffer + 6 >= end)
            break;

        IFF::SubChunkHeader head = IFF::LoadSubChunk(mFileBuffer);

        /*  A single test file (sonycam.lwo) seems to have invalid surface chunks.
         *  I'm assuming it's the fault of a single, unknown exporter so there are
         *  probably THOUSANDS of them. Here's a dirty workaround:
         *
         *  We don't break if the chunk limit is exceeded. Instead, we're computing
         *  how much storage is actually left and work with this value from now on.
         */
        if (mFileBuffer + head.length > end) {
            ASSIMP_LOG_ERROR("LWOB: Invalid surface chunk length. Trying to continue.");
            head.length = (uint16_t) (end - mFileBuffer);
        }

        uint8_t* const next = mFileBuffer+head.length;
        switch (head.type)
        {
        // diffuse color
        case AI_LWO_COLR:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,COLR,3);
                surf.mColor.r = GetU1() / 255.0f;
                surf.mColor.g = GetU1() / 255.0f;
                surf.mColor.b = GetU1() / 255.0f;
                break;
            }
        // diffuse strength ...
        case AI_LWO_DIFF:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,DIFF,2);
                surf.mDiffuseValue = GetU2() / 255.0f;
                break;
            }
        // specular strength ...
        case AI_LWO_SPEC:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,SPEC,2);
                surf.mSpecularValue = GetU2() / 255.0f;
                break;
            }
        // luminosity ...
        case AI_LWO_LUMI:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,LUMI,2);
                surf.mLuminosity = GetU2() / 255.0f;
                break;
            }
        // transparency
        case AI_LWO_TRAN:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,TRAN,2);
                surf.mTransparency = GetU2() / 255.0f;
                break;
            }
        // surface flags
        case AI_LWO_FLAG:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,FLAG,2);
                uint16_t flag = GetU2();
                if (flag & 0x4 )   surf.mMaximumSmoothAngle = 1.56207f;
                if (flag & 0x8 )   surf.mColorHighlights = 1.f;
                if (flag & 0x100)  surf.bDoubleSided = true;
                break;
            }
        // maximum smoothing angle
        case AI_LWO_SMAN:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,SMAN,4);
                surf.mMaximumSmoothAngle = std::fabs( GetF4() );
                break;
            }
        // glossiness
        case AI_LWO_GLOS:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,GLOS,2);
                surf.mGlossiness = (float)GetU2();
                break;
            }
        // color texture
        case AI_LWO_CTEX:
            {
                pTex = SetupNewTextureLWOB(surf.mColorTextures,
                    head.length);
                break;
            }
        // diffuse texture
        case AI_LWO_DTEX:
            {
                pTex = SetupNewTextureLWOB(surf.mDiffuseTextures,
                    head.length);
                break;
            }
        // specular texture
        case AI_LWO_STEX:
            {
                pTex = SetupNewTextureLWOB(surf.mSpecularTextures,
                    head.length);
                break;
            }
        // bump texture
        case AI_LWO_BTEX:
            {
                pTex = SetupNewTextureLWOB(surf.mBumpTextures,
                    head.length);
                break;
            }
        // transparency texture
        case AI_LWO_TTEX:
            {
                pTex = SetupNewTextureLWOB(surf.mOpacityTextures,
                    head.length);
                break;
            }
        // texture path
        case AI_LWO_TIMG:
            {
                if (pTex)   {
                    GetS0(pTex->mFileName,head.length);
                } else {
                    ASSIMP_LOG_WARN("LWOB: Unexpected TIMG chunk");
                }
                break;
            }
        // texture strength
        case AI_LWO_TVAL:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,TVAL,1);
                if (pTex)   {
                    pTex->mStrength = (float)GetU1()/ 255.f;
                } else {
                    ASSIMP_LOG_ERROR("LWOB: Unexpected TVAL chunk");
                }
                break;
            }
        // texture flags
        case AI_LWO_TFLG:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,TFLG,2);

                if (nullptr != pTex) {
                    const uint16_t s = GetU2();
                    if (s & 1)
                        pTex->majorAxis = LWO::Texture::AXIS_X;
                    else if (s & 2)
                        pTex->majorAxis = LWO::Texture::AXIS_Y;
                    else if (s & 4)
                        pTex->majorAxis = LWO::Texture::AXIS_Z;

                    if (s & 16) {
                        ASSIMP_LOG_WARN("LWOB: Ignoring \'negate\' flag on texture");
                    }
                }
                else {
                    ASSIMP_LOG_WARN("LWOB: Unexpected TFLG chunk");
                }
                break;
            }
        }
        mFileBuffer = next;
    }
}